

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::linked_ptr_internal::join(linked_ptr_internal *this,linked_ptr_internal *ptr)

{
  MutexBase *local_28;
  linked_ptr_internal *p;
  MutexLock lock;
  linked_ptr_internal *ptr_local;
  linked_ptr_internal *this_local;
  
  lock.mutex_ = (MutexBase *)ptr;
  GTestMutexLock::GTestMutexLock((GTestMutexLock *)&p,(MutexBase *)g_linked_ptr_mutex);
  for (local_28 = lock.mutex_; (MutexBase *)(local_28->mutex_).__align != lock.mutex_;
      local_28 = (MutexBase *)(local_28->mutex_).__align) {
  }
  (local_28->mutex_).__align = (long)this;
  this->next_ = (linked_ptr_internal *)lock.mutex_;
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)&p);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_linked_ptr_mutex) {
    MutexLock lock(&g_linked_ptr_mutex);

    linked_ptr_internal const* p = ptr;
    while (p->next_ != ptr) p = p->next_;
    p->next_ = this;
    next_ = ptr;
  }